

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

void cf_hc_reset(Curl_cfilter *cf,Curl_easy *data)

{
  uint uVar1;
  cf_hc_ctx *ctx;
  
  if (cf != (Curl_cfilter *)0x0) {
    cf_hc_baller_reset((cf_hc_baller *)(cf + 1),data);
    cf_hc_baller_reset((cf_hc_baller *)&cf[2].next,data);
    *(undefined4 *)&cf->cft = 0;
    cf->sockindex = 0;
    uVar1 = (data->set).happy_eyeballs_timeout;
    *(uint *)((long)&cf[3].ctx + 4) = uVar1;
    *(uint *)&cf[3].ctx = uVar1 >> 1;
  }
  return;
}

Assistant:

static void cf_hc_reset(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_hc_ctx *ctx = cf->ctx;

  if(ctx) {
    cf_hc_baller_reset(&ctx->h3_baller, data);
    cf_hc_baller_reset(&ctx->h21_baller, data);
    ctx->state = CF_HC_INIT;
    ctx->result = CURLE_OK;
    ctx->hard_eyeballs_timeout_ms = data->set.happy_eyeballs_timeout;
    ctx->soft_eyeballs_timeout_ms = data->set.happy_eyeballs_timeout / 2;
  }
}